

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

void borg_cheat_store(void)

{
  object *obj;
  int iVar1;
  int32_t iVar2;
  object **list_00;
  store_conflict *store;
  borg_item *item;
  bool bVar3;
  char local_b8 [8];
  char buf [120];
  borg_item *b_item;
  store *st_ptr;
  object **list;
  object *o_ptr;
  int local_10;
  wchar_t store_num;
  wchar_t i;
  wchar_t slot;
  
  list_00 = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  o_ptr._4_4_ = L'\0';
  do {
    if ((int)(uint)z_info->store_max <= o_ptr._4_4_) {
      mem_free(list_00);
      return;
    }
    store = stores + o_ptr._4_4_;
    for (local_10 = 0; local_10 < (int)(uint)z_info->store_inven_max; local_10 = local_10 + 1) {
      memset(borg_shops[o_ptr._4_4_].ware + local_10,0,0x388);
    }
    store_stock_list(store,list_00,(uint)z_info->store_inven_max);
    store_num = L'\0';
    while( true ) {
      bVar3 = false;
      if (store_num < (int)(uint)z_info->store_inven_max) {
        bVar3 = list_00[store_num] != (object *)0x0;
      }
      if (!bVar3) break;
      obj = list_00[store_num];
      item = borg_shops[o_ptr._4_4_].ware + store_num;
      object_desc(local_b8,0x78,obj,7,player);
      iVar1 = strcmp(local_b8,"(nothing)");
      if (iVar1 == 0) break;
      borg_item_analyze(item,obj,local_b8,o_ptr._4_4_ != L'\a');
      if (o_ptr._4_4_ == L'\0') {
        if ((item->tval == '\x1c') && ((uint)item->sval == sv_food_ration)) {
          borg_food_onsale = (wchar_t)item->iqty;
        }
        if ((item->tval == '\x1b') &&
           ((uint)borg_items[(int)(z_info->pack_size + 5)].sval == sv_light_lantern)) {
          borg_fuel_onsale = (wchar_t)item->iqty;
        }
        if ((item->tval == '\x13') &&
           ((uint)borg_items[(int)(z_info->pack_size + 5)].sval == sv_light_torch)) {
          borg_fuel_onsale = (wchar_t)item->iqty;
        }
      }
      iVar2 = borg_price_item(obj,false,L'\x01',o_ptr._4_4_);
      item->cost = iVar2;
      store_num = store_num + L'\x01';
    }
    o_ptr._4_4_ = o_ptr._4_4_ + L'\x01';
  } while( true );
}

Assistant:

void borg_cheat_store(void)
{
    int             slot, i;
    int             store_num;
    struct object*  o_ptr;
    struct object** list
        = mem_zalloc(sizeof(struct object*) * z_info->store_inven_max);

    /* Scan each store */
    for (store_num = 0; store_num < z_info->store_max; store_num++) {
        struct store* st_ptr = &stores[store_num];

        /* Clear the Inventory from memory */
        for (i = 0; i < z_info->store_inven_max; i++) {
            /* Wipe the ware */
            memset(&borg_shops[store_num].ware[i], 0, sizeof(borg_item));
        }

        store_stock_list(st_ptr, list, z_info->store_inven_max);

        /* Check each existing object in this store */
        for (slot = 0; slot < z_info->store_inven_max && list[slot]; slot++) {
            o_ptr             = list[slot];
            borg_item* b_item = &borg_shops[store_num].ware[slot];
            char       buf[120];

            /* Describe the item */
            object_desc(
                buf, sizeof(buf), o_ptr, ODESC_FULL | ODESC_STORE, player);
            if (streq(buf, "(nothing)"))
                break;

            /* Analyze the item */
            borg_item_analyze(
                b_item, o_ptr, buf, store_num == 7 ? false : true);

            /* Check if the general store has certain items */
            if (store_num == 0) {
                /* Food -- needed for money scumming */
                if (b_item->tval == TV_FOOD && b_item->sval == sv_food_ration)
                    borg_food_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_FLASK
                    && borg_items[INVEN_LIGHT].sval == sv_light_lantern)
                    borg_fuel_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_LIGHT
                    && borg_items[INVEN_LIGHT].sval == sv_light_torch)
                    borg_fuel_onsale = b_item->iqty;
            }

            /* Hack -- Save the declared cost */
            b_item->cost = borg_price_item(o_ptr, false, 1, store_num);
        }
    }
    mem_free(list);
}